

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O1

vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
* __thiscall
argstest::NamedBase::GetDescription_abi_cxx11_
          (vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           *__return_storage_ptr__,NamedBase *this,HelpParams *params,uint indentLevel)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  bool bVar3;
  undefined8 this_00;
  string *delimiter;
  initializer_list<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  __l;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  description;
  string local_138;
  string *local_118;
  undefined8 local_110;
  undefined1 local_108 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  size_type local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  string *local_d0;
  undefined8 local_c8;
  undefined1 local_c0 [24];
  undefined1 local_a8 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  undefined1 local_70 [32];
  string local_50;
  
  paVar1 = &local_138.field_2;
  local_138._M_string_length = 0;
  local_138.field_2._M_local_buf[0] = '\0';
  delimiter = (string *)local_108;
  local_110 = 0;
  local_108[0] = 0;
  local_138._M_dataplus._M_p = (pointer)paVar1;
  local_118 = delimiter;
  (*(this->super_Base)._vptr_Base[0x13])(local_108 + 0x10);
  std::__cxx11::string::operator=((string *)&local_118,(string *)(local_108 + 0x10));
  if ((size_type *)
      CONCAT44(local_f8._M_allocated_capacity._4_4_,local_f8._M_allocated_capacity._0_4_) !=
      &local_e8) {
    operator_delete((size_type *)
                    CONCAT44(local_f8._M_allocated_capacity._4_4_,
                             local_f8._M_allocated_capacity._0_4_));
  }
  std::__cxx11::string::_M_assign((string *)&local_138);
  bVar2 = this->choicesStringManual;
  local_a8._0_8_ = local_a8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,", ","");
  local_c0._16_8_ = __return_storage_ptr__;
  detail::Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((string *)(local_108 + 0x10),(detail *)&this->choicesStrings,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_a8,delimiter);
  bVar3 = params->addChoices;
  (*(this->super_Base)._vptr_Base[0x12])(&local_88,this,params);
  local_70._0_8_ = (pointer)(local_70 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,", ","");
  detail::Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_50,(detail *)&local_88,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_70,delimiter);
  AddDescriptionPostfix
            (this,&local_138,bVar2,(string *)(local_108 + 0x10),bVar3,&local_50,
             &params->choiceString);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((pointer)local_70._0_8_ != (pointer)(local_70 + 0x10)) {
    operator_delete((void *)local_70._0_8_);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  if ((size_type *)
      CONCAT44(local_f8._M_allocated_capacity._4_4_,local_f8._M_allocated_capacity._0_4_) !=
      &local_e8) {
    operator_delete((size_type *)
                    CONCAT44(local_f8._M_allocated_capacity._4_4_,
                             local_f8._M_allocated_capacity._0_4_));
  }
  if ((pointer)local_a8._0_8_ != (pointer)(local_a8 + 0x10)) {
    operator_delete((void *)local_a8._0_8_);
  }
  bVar2 = this->defaultStringManual;
  bVar3 = params->addDefault;
  (*(this->super_Base)._vptr_Base[0x11])(local_108 + 0x10,this,params);
  AddDescriptionPostfix
            (this,&local_138,bVar2,&this->defaultString,bVar3,(string *)(local_108 + 0x10),
             &params->defaultString);
  this_00 = local_c0._16_8_;
  if ((size_type *)
      CONCAT44(local_f8._M_allocated_capacity._4_4_,local_f8._M_allocated_capacity._0_4_) !=
      &local_e8) {
    operator_delete((size_type *)
                    CONCAT44(local_f8._M_allocated_capacity._4_4_,
                             local_f8._M_allocated_capacity._0_4_));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p == paVar1) {
    local_e0._8_8_ = local_138.field_2._8_8_;
    local_f8._8_8_ = &local_e0;
  }
  else {
    local_f8._8_8_ = local_138._M_dataplus._M_p;
  }
  local_e0._M_allocated_capacity._1_7_ = local_138.field_2._M_allocated_capacity._1_7_;
  local_e0._M_local_buf[0] = local_138.field_2._M_local_buf[0];
  local_e8 = local_138._M_string_length;
  local_138._M_string_length = 0;
  local_138.field_2._M_local_buf[0] = '\0';
  if (local_118 == (string *)local_108) {
    local_c0._8_8_ = local_108._8_8_;
    local_d0 = (string *)local_c0;
  }
  else {
    local_d0 = local_118;
  }
  local_c0._1_7_ = local_108._1_7_;
  local_c0[0] = local_108[0];
  local_c8 = local_110;
  local_110 = 0;
  local_108[0] = 0;
  __l._M_len = 1;
  __l._M_array = (iterator)(local_108 + 0x10);
  local_138._M_dataplus._M_p = (pointer)paVar1;
  local_118 = (string *)local_108;
  local_f8._M_allocated_capacity._0_4_ = indentLevel;
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::vector((vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
            *)this_00,__l,(allocator_type *)local_a8);
  if (local_d0 != (string *)local_c0) {
    operator_delete(local_d0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._8_8_ != &local_e0) {
    operator_delete((void *)local_f8._8_8_);
  }
  if (local_118 != (string *)local_108) {
    operator_delete(local_118);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != paVar1) {
    operator_delete(local_138._M_dataplus._M_p);
  }
  return (vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
          *)this_00;
}

Assistant:

virtual std::vector<std::tuple<std::string, std::string, unsigned>> GetDescription(const HelpParams &params, const unsigned indentLevel) const override
            {
                std::tuple<std::string, std::string, unsigned> description;
                std::get<0>(description) = GetNameString(params);
                std::get<1>(description) = help;
                std::get<2>(description) = indentLevel;

                AddDescriptionPostfix(std::get<1>(description), choicesStringManual, detail::Join(choicesStrings, ", "), params.addChoices, detail::Join(GetChoicesStrings(params), ", "), params.choiceString);
                AddDescriptionPostfix(std::get<1>(description), defaultStringManual, defaultString, params.addDefault, GetDefaultString(params), params.defaultString);

                return { std::move(description) };
            }